

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ldebug.c
# Opt level: O2

int luaG_getfuncline(Proto *f,int pc)

{
  AbsLineInfo *pAVar1;
  ulong uVar2;
  int iVar3;
  long lVar4;
  uint uVar5;
  int *piVar6;
  ulong uVar7;
  
  if (f->lineinfo == (ls_byte *)0x0) {
    iVar3 = -1;
  }
  else {
    lVar4 = (long)f->sizeabslineinfo;
    if ((lVar4 == 0) || (pAVar1 = f->abslineinfo, pc < pAVar1->pc)) {
      piVar6 = &f->linedefined;
      lVar4 = -1;
    }
    else {
      uVar2 = (ulong)((uint)pc >> 7);
      uVar5 = f->sizeabslineinfo;
      if (lVar4 < (long)uVar2) {
        uVar5 = (uint)pc >> 7;
      }
      do {
        uVar7 = uVar2;
        if (lVar4 <= (long)uVar7) goto LAB_00106200;
        uVar2 = uVar7 + 1;
      } while (pAVar1[uVar7].pc <= pc);
      uVar5 = (uint)uVar7;
LAB_00106200:
      piVar6 = &pAVar1[(int)(uVar5 - 1)].line;
      lVar4 = (long)pAVar1[(int)(uVar5 - 1)].pc;
    }
    iVar3 = *piVar6;
    for (; lVar4 < pc; lVar4 = lVar4 + 1) {
      iVar3 = iVar3 + f->lineinfo[lVar4 + 1];
    }
  }
  return iVar3;
}

Assistant:

int luaG_getfuncline (const Proto *f, int pc) {
  if (f->lineinfo == NULL)  /* no debug information? */
    return -1;
  else {
    int basepc;
    int baseline = getbaseline(f, pc, &basepc);
    while (basepc++ < pc) {  /* walk until given instruction */
      lua_assert(f->lineinfo[basepc] != ABSLINEINFO);
      baseline += f->lineinfo[basepc];  /* correct line */
    }
    return baseline;
  }
}